

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_shi_8_al(void)

{
  uint value;
  uint address;
  uint uVar1;
  
  address = m68ki_read_imm_32();
  uVar1 = 0xff;
  if (m68ki_cpu.not_z_flag == 0) {
    uVar1 = 0;
  }
  value = 0;
  if ((m68ki_cpu.c_flag >> 8 & 1) == 0) {
    value = uVar1;
  }
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_shi_8_al(void)
{
	m68ki_write_8(EA_AL_8(), COND_HI() ? 0xff : 0);
}